

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_get_token(char **ptr,char *delimiter,char *token,int *isanumber)

{
  char cVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  char *loc;
  char tval [73];
  byte *local_90;
  char local_88 [72];
  undefined1 local_40;
  
  *token = '\0';
  pcVar4 = *ptr;
  cVar1 = *pcVar4;
  while (cVar1 == ' ') {
    pcVar4 = pcVar4 + 1;
    *ptr = pcVar4;
    cVar1 = *pcVar4;
  }
  sVar2 = strcspn(pcVar4,delimiter);
  iVar5 = (int)sVar2;
  if (iVar5 != 0) {
    strncat(token,pcVar4,(long)iVar5);
    *ptr = *ptr + iVar5;
    if (isanumber != (int *)0x0) {
      *isanumber = 1;
      pcVar4 = strchr(token,0x44);
      if (pcVar4 != (char *)0x0) {
        strncpy(local_88,token,0x48);
        local_40 = 0;
        local_90 = (byte *)strchr(local_88,0x44);
        token = local_88;
        if (local_90 != (byte *)0x0) {
          *local_90 = 0x45;
        }
      }
      strtod(token,(char **)&local_90);
      if ((*local_90 & 0xdf) != 0) {
        *isanumber = 0;
      }
      piVar3 = __errno_location();
      if (*piVar3 == 0x22) {
        *isanumber = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int fits_get_token(char **ptr, 
                   char *delimiter,
                   char *token,
                   int *isanumber)   /* O - is this token a number? */
/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    *token = '\0';

    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
        strncat(token, *ptr, slen);       /* copy token */

        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(token, 'D'))  {
	        strncpy(tval, token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}